

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O2

Expression * __thiscall slang::ast::ClassType::getBaseConstructorCall(ClassType *this)

{
  Scope *this_00;
  Statement *pSVar1;
  SyntaxNode *pSVar2;
  Symbol *symbol;
  optional<slang::SourceRange> sourceRange;
  optional<slang::SourceRange> sourceRange_00;
  Statement *pSVar3;
  bool bVar4;
  SubroutineSymbol *this_01;
  Statement *stmt;
  Diagnostic *pDVar5;
  SourceLocation SVar6;
  SourceLocation argSyntax_00;
  Expression *pEVar7;
  Diagnostic *this_02;
  SourceLocation context;
  ushort uVar8;
  DiagCode noteCode;
  long lVar9;
  SyntaxNode *argSyntax;
  Expression *thisClass;
  SourceRange SVar10;
  ArgList AVar11;
  Expression *callExpr;
  anon_class_8_1_dd9b6ef1 checkForSuperNew;
  Expression *local_d8;
  anon_class_8_1_dd9b6ef1 local_d0;
  SymbolIndex local_c8;
  bitmask<slang::ast::ASTFlags> local_c0;
  Symbol *pSStack_b8;
  TempVarSymbol *local_b0;
  RandomizeDetails *pRStack_a8;
  AssertionInstanceDetails *local_a0;
  _Storage<slang::SourceRange,_true> local_98;
  undefined1 local_88;
  undefined7 uStack_87;
  _Storage<slang::SourceRange,_true> local_80;
  undefined1 local_70;
  undefined7 uStack_6f;
  undefined8 local_68;
  Info *local_60;
  undefined1 local_38;
  
  if ((this->baseConstructorCall).super__Optional_base<const_slang::ast::Expression_*,_true,_true>.
      _M_payload.super__Optional_payload_base<const_slang::ast::Expression_*>._M_engaged == true) {
    return (this->baseConstructorCall).
           super__Optional_base<const_slang::ast::Expression_*,_true,_true>._M_payload.
           super__Optional_payload_base<const_slang::ast::Expression_*>._M_payload._M_value;
  }
  (this->baseConstructorCall).super__Optional_base<const_slang::ast::Expression_*,_true,_true>.
  _M_payload.super__Optional_payload_base<const_slang::ast::Expression_*>._M_engaged = true;
  (this->baseConstructorCall).super__Optional_base<const_slang::ast::Expression_*,_true,_true>.
  _M_payload.super__Optional_payload_base<const_slang::ast::Expression_*>._M_payload._M_value =
       (Expression *)0x0;
  local_d8 = (Expression *)0x0;
  pSVar2 = (this->super_Type).super_Symbol.originatingSyntax;
  if (*(long *)(pSVar2 + 6) == 0) {
    return (Expression *)0x0;
  }
  this_00 = &this->super_Scope;
  Scope::ensureElaborated(this_00);
  bVar4 = Type::isError(this->baseClass);
  if (bVar4) {
    return (Expression *)0x0;
  }
  this_01 = getConstructor(this);
  if (this_01 == (SubroutineSymbol *)0x0) {
    uVar8 = 0;
    pEVar7 = (Expression *)0x0;
  }
  else {
    local_d0.callExpr = &local_d8;
    uVar8 = (this_01->flags).m_bits;
    stmt = SubroutineSymbol::getBody(this_01);
    if (stmt->kind == Invalid) {
      return (Expression *)0x0;
    }
    uVar8 = uVar8 >> 0xc;
    if (stmt->kind == List) {
      pSVar1 = stmt + 1;
      pSVar3 = stmt + 1;
      lVar9 = 0;
      do {
        pEVar7 = local_d8;
        if ((long)pSVar3->syntax << 3 == lVar9) goto LAB_0028ac10;
        stmt = *(Statement **)(*(long *)pSVar1 + lVar9);
        lVar9 = lVar9 + 8;
      } while (stmt->kind == VariableDeclaration);
    }
    getBaseConstructorCall::anon_class_8_1_dd9b6ef1::operator()(&local_d0,stmt);
    pEVar7 = local_d8;
  }
LAB_0028ac10:
  local_c8 = this->headerIndex;
  local_c0.m_bits = 0;
  pSStack_b8 = (Symbol *)0x0;
  local_a0 = (AssertionInstanceDetails *)0x0;
  local_b0 = (TempVarSymbol *)0x0;
  pRStack_a8 = (RandomizeDetails *)0x0;
  pSVar2 = *(SyntaxNode **)(pSVar2 + 6);
  thisClass = *(Expression **)(pSVar2 + 2);
  local_d0.callExpr = (Expression **)this_00;
  if (pEVar7 == (Expression *)0x0) {
    if (thisClass == (Expression *)0x0) goto LAB_0028ad4f;
    if (this->baseConstructor == (Symbol *)0x0) {
      if (thisClass[1].sourceRange.endLoc != (SourceLocation)0x0) {
        SVar10 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)thisClass);
        pDVar5 = ASTContext::addDiag((ASTContext *)&local_d0,(DiagCode)0xa00007,SVar10);
        Diagnostic::operator<<(pDVar5,(this->baseClass->super_Symbol).name);
        Diagnostic::operator<<<int>(pDVar5,0);
        Diagnostic::operator<<<unsigned_long>
                  (pDVar5,(long)thisClass[1].sourceRange.endLoc + 1U >> 1);
      }
    }
    else {
      local_80._M_value = slang::syntax::SyntaxNode::sourceRange(pSVar2);
      context = local_80._M_value.endLoc;
      argSyntax_00 = local_80._M_value.startLoc;
      local_70 = 1;
      sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_6f;
      sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged = true;
      sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value = local_80._M_value;
      SVar6 = context;
      Lookup::ensureVisible(this->baseConstructor,(ASTContext *)&local_d0,sourceRange);
      local_68 = this->baseConstructor;
      local_38 = 0;
      SVar10.endLoc = SVar6;
      SVar10.startLoc = (SourceLocation)&local_d0;
      local_d8 = CallExpression::fromArgs
                           ((CallExpression *)*local_d0.callExpr,
                            (Compilation *)&stack0xffffffffffffff98,(Subroutine *)0x0,thisClass,
                            (ArgumentListSyntax *)argSyntax_00,SVar10,(ASTContext *)context);
    }
  }
  else {
    if ((thisClass != (Expression *)0x0) ||
       (thisClass = (Expression *)pSVar2[2].parent, thisClass != (Expression *)0x0)) {
      pDVar5 = ASTContext::addDiag((ASTContext *)&local_d0,(DiagCode)0x70006,pEVar7->sourceRange);
      _local_68 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)thisClass);
      SVar6 = parsing::Token::location((Token *)&stack0xffffffffffffff98);
      noteCode.subsystem = General;
      noteCode.code = 0xc;
      goto LAB_0028ac96;
    }
LAB_0028ad4f:
    if (pSVar2[2].parent != (SyntaxNode *)0x0) {
      if ((uVar8 & 1) == 0) {
        pDVar5 = ASTContext::addDiag((ASTContext *)&local_d0,(DiagCode)0x640007,
                                     (this_01->super_Symbol).location);
        SVar10 = slang::syntax::SyntaxNode::sourceRange(pSVar2[2].parent);
        Diagnostic::addNote(pDVar5,(DiagCode)0xc0001,SVar10);
      }
      uVar8 = 1;
    }
  }
  if (local_d8 == (Expression *)0x0 &&
      (SubroutineSymbol *)this->baseConstructor != (SubroutineSymbol *)0x0) {
    if ((uVar8 & 1) == 0) {
      AVar11 = SubroutineSymbol::getArguments((SubroutineSymbol *)this->baseConstructor);
      lVar9 = 0;
      do {
        if (AVar11._M_extent._M_extent_value._M_extent_value << 3 == lVar9) {
          symbol = this->baseConstructor;
          local_98._M_value = slang::syntax::SyntaxNode::sourceRange(pSVar2);
          local_88 = 1;
          sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_87;
          sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._M_engaged = true;
          sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._M_payload._M_value = local_98._M_value;
          Lookup::ensureVisible(symbol,(ASTContext *)&local_d0,sourceRange_00);
          goto LAB_0028aeeb;
        }
        pEVar7 = FormalArgumentSymbol::getDefaultValue
                           (*(FormalArgumentSymbol **)((long)AVar11._M_ptr + lVar9));
        lVar9 = lVar9 + 8;
      } while (pEVar7 != (Expression *)0x0);
      SVar10 = slang::syntax::SyntaxNode::sourceRange(pSVar2);
      pDVar5 = ASTContext::addDiag((ASTContext *)&local_d0,(DiagCode)0x80006,SVar10);
      this_02 = Diagnostic::operator<<(pDVar5,(this->super_Type).super_Symbol.name);
      Diagnostic::operator<<(this_02,(this->baseClass->super_Symbol).name);
      SVar6 = this->baseConstructor->location;
      noteCode.subsystem = General;
      noteCode.code = 5;
LAB_0028ac96:
      Diagnostic::addNote(pDVar5,noteCode,SVar6);
      return (Expression *)0x0;
    }
    local_d8 = (Expression *)0x0;
  }
LAB_0028aeeb:
  (this->baseConstructorCall).super__Optional_base<const_slang::ast::Expression_*,_true,_true>.
  _M_payload.super__Optional_payload_base<const_slang::ast::Expression_*>._M_payload._M_value =
       local_d8;
  (this->baseConstructorCall).super__Optional_base<const_slang::ast::Expression_*,_true,_true>.
  _M_payload.super__Optional_payload_base<const_slang::ast::Expression_*>._M_engaged = true;
  return local_d8;
}

Assistant:

const Expression* ClassType::getBaseConstructorCall() const {
    if (baseConstructorCall)
        return *baseConstructorCall;

    baseConstructorCall = nullptr;
    const Expression* callExpr = nullptr;

    auto syntax = getSyntax();
    SLANG_ASSERT(syntax);

    auto& classSyntax = syntax->as<ClassDeclarationSyntax>();
    if (!classSyntax.extendsClause)
        return nullptr;

    ensureElaborated();

    SLANG_ASSERT(baseClass);
    if (baseClass->isError())
        return nullptr;

    // If we have a constructor, find whether it invokes super.new in its body.
    bool constructorHasDefault = false;
    auto ourConstructor = getConstructor();
    if (ourConstructor) {
        auto checkForSuperNew = [&](const Statement& stmt) {
            if (stmt.kind == StatementKind::ExpressionStatement) {
                auto& expr = stmt.as<ExpressionStatement>().expr;
                if (expr.kind == ExpressionKind::NewClass &&
                    expr.as<NewClassExpression>().isSuperClass) {
                    callExpr = &expr;
                }
            }
        };

        // If the body is invalid, early out now so we don't report
        // spurious errors on top of it.
        constructorHasDefault = ourConstructor->flags.has(MethodFlags::DefaultedSuperArg);
        auto& body = ourConstructor->getBody();
        if (body.bad())
            return nullptr;

        if (body.kind != StatementKind::List) {
            checkForSuperNew(body);
        }
        else {
            for (auto stmt : body.as<StatementList>().list) {
                if (stmt->kind != StatementKind::VariableDeclaration) {
                    checkForSuperNew(*stmt);
                    break;
                }
            }
        }
    }

    ASTContext context(*this, LookupLocation(this, uint32_t(headerIndex)));
    auto& extendsClause = *classSyntax.extendsClause;

    // Can't have both a super.new and extends arguments.
    if (callExpr && (extendsClause.arguments || extendsClause.defaultedArg)) {
        auto argSyntax = extendsClause.arguments ? (const SyntaxNode*)extendsClause.arguments
                                                 : extendsClause.defaultedArg;
        auto& diag = context.addDiag(diag::BaseConstructorDuplicate, callExpr->sourceRange);
        diag.addNote(diag::NotePreviousUsage, argSyntax->getFirstToken().location());
        return nullptr;
    }

    if (auto extendsArgs = extendsClause.arguments) {
        // If we have a base class constructor, create the call to it.
        if (baseConstructor) {
            SourceRange range = extendsClause.sourceRange();
            Lookup::ensureVisible(*baseConstructor, context, range);

            callExpr = &CallExpression::fromArgs(context.getCompilation(),
                                                 &baseConstructor->as<SubroutineSymbol>(), nullptr,
                                                 extendsArgs, range, context);
        }
        else if (!extendsArgs->parameters.empty()) {
            auto& diag = context.addDiag(diag::TooManyArguments, extendsArgs->sourceRange());
            diag << baseClass->name;
            diag << 0;
            diag << extendsArgs->parameters.size();
        }
    }
    else if (extendsClause.defaultedArg) {
        SLANG_ASSERT(ourConstructor);
        if (!constructorHasDefault) {
            auto& diag = context.addDiag(diag::InvalidExtendsDefault, ourConstructor->location);
            diag.addNote(diag::NotePreviousUsage, extendsClause.defaultedArg->sourceRange());
        }

        constructorHasDefault = true;
    }

    // If we have a base class constructor and nothing called it, make sure
    // it has no arguments or all of the arguments have default values.
    // If our own constructor declares a 'default' arg then this requirement
    // is removed since we will insert the appropriate call arguments automatically.
    if (baseConstructor && !callExpr && !constructorHasDefault) {
        for (auto arg : baseConstructor->as<SubroutineSymbol>().getArguments()) {
            if (!arg->getDefaultValue()) {
                auto& diag = context.addDiag(diag::BaseConstructorNotCalled,
                                             extendsClause.sourceRange());
                diag << name << baseClass->name;
                diag.addNote(diag::NoteDeclarationHere, baseConstructor->location);
                return nullptr;
            }
        }

        Lookup::ensureVisible(*baseConstructor, context, extendsClause.sourceRange());
    }

    baseConstructorCall = callExpr;
    return callExpr;
}